

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

void tcg_opt_gen_mov(TCGContext_conflict9 *s,TCGOp *op,TCGArg dst,TCGArg src)

{
  byte bVar1;
  undefined1 *puVar2;
  TCGArg TVar3;
  undefined1 *puVar4;
  long lVar5;
  tcg_temp_info *ti;
  undefined1 uVar6;
  ulong uVar7;
  undefined1 uVar8;
  TCGArg TVar9;
  
  if (dst != src) {
    puVar2 = *(undefined1 **)(dst + 0x30);
    TVar3 = *(TCGArg *)(puVar2 + 0x10);
    puVar4 = *(undefined1 **)(src + 0x30);
    if ((TVar3 != dst) && (TVar9 = TVar3, *(TCGArg *)(puVar4 + 0x10) != src)) {
      do {
        if (TVar9 == src) goto LAB_00d4a45f;
        TVar9 = *(TCGArg *)(*(long *)(TVar9 + 0x30) + 0x10);
      } while (TVar9 != dst);
    }
    lVar5 = *(long *)(*(long *)(puVar2 + 8) + 0x30);
    *(long *)(*(long *)(TVar3 + 0x30) + 8) = *(long *)(puVar2 + 8);
    *(TCGArg *)(lVar5 + 0x10) = TVar3;
    *(TCGArg *)(puVar2 + 0x10) = dst;
    *(TCGArg *)(puVar2 + 8) = dst;
    *puVar2 = 0;
    *(undefined8 *)(puVar2 + 0x20) = 0xffffffffffffffff;
    bVar1 = s->tcg_op_defs[*(byte *)op].flags;
    uVar8 = 0x3f;
    if ((bVar1 & 0x10) == 0) {
      uVar8 = 5;
    }
    uVar6 = 0x89;
    if ((bVar1 & 0x40) == 0) {
      uVar6 = uVar8;
    }
    *(undefined1 *)op = uVar6;
    op->args[0] = dst;
    op->args[1] = src;
    uVar7 = *(ulong *)(puVar4 + 0x20) | 0xffffffff00000000;
    if ((bVar1 & 0x50) != 0) {
      uVar7 = *(ulong *)(puVar4 + 0x20);
    }
    *(ulong *)(puVar2 + 0x20) = uVar7;
    if (((*(uint *)dst ^ *(uint *)src) & 0xff000000) == 0) {
      lVar5 = *(long *)(*(long *)(puVar4 + 0x10) + 0x30);
      *(long *)(puVar2 + 0x10) = *(long *)(puVar4 + 0x10);
      *(TCGArg *)(puVar2 + 8) = src;
      *(TCGArg *)(lVar5 + 8) = dst;
      *(TCGArg *)(puVar4 + 0x10) = dst;
      *puVar2 = *puVar4;
      *(undefined8 *)(puVar2 + 0x18) = *(undefined8 *)(puVar4 + 0x18);
    }
    return;
  }
LAB_00d4a45f:
  tcg_op_remove_tricore(s,op);
  return;
}

Assistant:

static void tcg_opt_gen_mov(TCGContext *s, TCGOp *op, TCGArg dst, TCGArg src)
{
    TCGTemp *dst_ts = arg_temp(dst);
    TCGTemp *src_ts = arg_temp(src);
    const TCGOpDef *def;
    struct tcg_temp_info *di;
    struct tcg_temp_info *si;
    tcg_target_ulong mask;
    TCGOpcode new_op;

    if (ts_are_copies(dst_ts, src_ts)) {
        tcg_op_remove(s, op);
        return;
    }

    reset_ts(dst_ts);
    di = ts_info(dst_ts);
    si = ts_info(src_ts);
    def = &s->tcg_op_defs[op->opc];
    if (def->flags & TCG_OPF_VECTOR) {
        new_op = INDEX_op_mov_vec;
    } else if (def->flags & TCG_OPF_64BIT) {
        new_op = INDEX_op_mov_i64;
    } else {
        new_op = INDEX_op_mov_i32;
    }
    op->opc = new_op;
    /* TCGOP_VECL and TCGOP_VECE remain unchanged.  */
    op->args[0] = dst;
    op->args[1] = src;

    mask = si->mask;
    if (TCG_TARGET_REG_BITS > 32 && new_op == INDEX_op_mov_i32) {
        /* High bits of the destination are now garbage.  */
        mask |= ~0xffffffffull;
    }
    di->mask = mask;

    if (src_ts->type == dst_ts->type) {
        struct tcg_temp_info *ni = ts_info(si->next_copy);

        di->next_copy = si->next_copy;
        di->prev_copy = src_ts;
        ni->prev_copy = dst_ts;
        si->next_copy = dst_ts;
        di->is_const = si->is_const;
        di->val = si->val;
    }
}